

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

HierarchicalValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
          (BumpAllocator *this,Scope *args,ValueSymbol *args_1,HierarchicalReference *args_2,
          SourceRange *args_3)

{
  HierarchicalValueExpression *this_00;
  
  this_00 = (HierarchicalValueExpression *)allocate(this,0x60,8);
  ast::HierarchicalValueExpression::HierarchicalValueExpression(this_00,args,args_1,args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }